

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

char * loopconc(ident *id,int n,uint *body,bool space)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char local_86 [2];
  int local_84;
  char *pcStack_80;
  int len;
  char *vstr;
  tagval v;
  int local_54;
  undefined1 local_50 [4];
  int i;
  vector<char> s;
  identstack stack;
  bool space_local;
  uint *body_local;
  int n_local;
  ident *id_local;
  
  vector<char>::vector((vector<char> *)local_50);
  for (local_54 = 0; local_54 < n; local_54 = local_54 + 1) {
    setiter(id,local_54,(identstack *)&s.alen);
    executeret(body,(tagval *)&vstr);
    pcStack_80 = tagval::getstr((tagval *)&vstr);
    sVar2 = strlen(pcStack_80);
    local_84 = (int)sVar2;
    if ((space) && (local_54 != 0)) {
      local_86[1] = 0x20;
      vector<char>::add((vector<char> *)local_50,local_86 + 1);
    }
    vector<char>::put((vector<char> *)local_50,pcStack_80,local_84);
    freearg((tagval *)&vstr);
  }
  poparg(id);
  local_86[0] = '\0';
  vector<char>::add((vector<char> *)local_50,local_86);
  pcVar3 = vector<char>::getbuf((vector<char> *)local_50);
  iVar1 = vector<char>::length((vector<char> *)local_50);
  pcVar3 = newstring(pcVar3,(long)(iVar1 + -1));
  vector<char>::~vector((vector<char> *)local_50);
  return pcVar3;
}

Assistant:

char *loopconc(ident *id, int n, uint *body, bool space)
{
    identstack stack;
    vector<char> s;
    loopi(n)
    {
        setiter(*id, i, stack);
        tagval v;
        executeret(body, v);
        const char *vstr = v.getstr();
        int len = strlen(vstr);
        if(space && i) s.add(' ');
        s.put(vstr, len);
        freearg(v);
    }
    poparg(*id);
    s.add('\0');
    return newstring(s.getbuf(), s.length()-1);
}